

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel1.cpp
# Opt level: O1

int256_t * __thiscall
primesum::pi_lmo_parallel1(int256_t *__return_storage_ptr__,primesum *this,int128_t x,int threads)

{
  ulong *puVar1;
  char *pcVar2;
  pointer paVar3;
  pointer piVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double alpha;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  int256_t res;
  undefined1 auVar11 [16];
  uint128_t uVar12;
  uint128_t uVar13;
  pointer piVar14;
  int128_t *piVar15;
  ulong uVar16;
  int64_t c;
  ulong uVar17;
  pointer piVar18;
  pointer pcVar19;
  pointer pcVar20;
  int in_ECX;
  long lVar21;
  undefined4 in_register_00000014;
  ulong uVar22;
  ulong extraout_RDX;
  int iVar23;
  long lVar24;
  int128_t *piVar25;
  int iVar26;
  size_type sVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  int *piVar35;
  int iVar36;
  uint64_t uVar37;
  uint64_t uVar38;
  int128_t *piVar39;
  ulong uVar40;
  size_type low;
  uint64_t uVar41;
  ulong uVar42;
  long lVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  undefined4 uVar47;
  double dVar48;
  undefined4 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int256_t s2;
  size_type __dnew;
  int64_t segments_per_thread;
  int64_t segment_size;
  vector<int,_std::allocator<int>_> primes;
  S2LoadBalancer loadBalancer;
  BitSieve sieve;
  aligned_vector<double> timings;
  vector<int,_std::allocator<int>_> pi;
  vector<int,_std::allocator<int>_> mu;
  vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> phi_total;
  Wheel wheel;
  vector<int,_std::allocator<int>_> lpf;
  aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_> phi;
  aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_> mu_sum;
  int256_t s1;
  int256_t p2;
  undefined8 in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  ulong local_388;
  long local_380;
  pointer local_378;
  ulong local_370;
  long local_340;
  ulong local_330;
  int local_324;
  string local_308;
  ulong local_2e0;
  ulong local_2d8;
  uint64_t local_2d0;
  ulong local_2c8;
  uint64_t local_2c0;
  int64_t local_2b8;
  uint64_t local_2b0;
  size_type local_2a8;
  uint64_t local_2a0;
  int128_t *local_298;
  ulong local_290;
  uint64_t local_288;
  pointer local_280;
  size_t local_278;
  size_type local_270;
  int128_t *local_268;
  pointer local_260;
  long local_258;
  vector<int,_std::allocator<int>_> local_250;
  undefined1 local_238 [88];
  BitSieve local_1e0;
  size_type local_1c0;
  double local_1b8;
  uint64_t local_1b0;
  size_t local_1a8;
  long local_1a0;
  vector<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
  local_198;
  vector<int,_std::allocator<int>_> local_180;
  int256_t local_168;
  vector<int,_std::allocator<int>_> local_140;
  vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> local_128;
  Wheel local_110;
  double local_f8;
  int256_t *local_f0;
  long local_e8;
  double local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
  local_a8;
  vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
  local_90;
  int256_t local_78;
  pointer local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  
  lVar21 = CONCAT44(in_register_00000014,threads);
  if (-lVar21 < (long)(ulong)((primesum *)0x1 < this)) {
    auVar52._8_8_ = in_stack_fffffffffffffc60;
    auVar52._0_8_ = in_stack_fffffffffffffc58;
    local_f0 = __return_storage_ptr__;
    alpha = get_alpha_lmo(this,(int128_t)auVar52);
    dVar48 = (double)__floattidf(this,lVar21);
    dVar48 = pow(dVar48,0.3333333333333333);
    auVar50 = __fixdfti(SUB84(dVar48,0));
    if ((long)(ulong)(auVar50._0_8_ == 0) <= auVar50._8_8_) {
      do {
        lVar24 = auVar50._8_8_;
        uVar17 = auVar50._0_8_;
        iVar26 = 2;
        auVar52 = ZEXT816(1);
        do {
          auVar52 = auVar50 * auVar52;
          iVar26 = iVar26 + -1;
        } while (iVar26 != 0);
        auVar51 = __divti3(this,lVar21,uVar17,lVar24);
        uVar22 = (ulong)(auVar51._0_8_ < auVar52._0_8_);
        lVar43 = auVar51._8_8_ - auVar52._8_8_;
        if ((SBORROW8(auVar51._8_8_,auVar52._8_8_) != SBORROW8(lVar43,uVar22)) ==
            (long)(lVar43 - uVar22) < 0) goto LAB_001215fd;
        auVar50._8_8_ = lVar24 + -1 + (ulong)(uVar17 != 0);
        auVar50._0_8_ = uVar17 - 1;
      } while (-lVar24 < (long)(ulong)(1 < uVar17));
      auVar50 = ZEXT816(0);
    }
LAB_001215fd:
    do {
      uVar22 = auVar50._0_8_;
      uVar40 = uVar22 + 1;
      lVar43 = auVar50._8_8_ + (ulong)(0xfffffffffffffffe < uVar22);
      auVar50._8_8_ = lVar43;
      auVar50._0_8_ = uVar40;
      iVar26 = 2;
      lVar24 = 0;
      uVar17 = 1;
      do {
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar17;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar40;
        uVar16 = SUB168(auVar51 * auVar8,0);
        lVar24 = lVar24 * uVar40 + uVar17 * lVar43 + SUB168(auVar51 * auVar8,8);
        iVar26 = iVar26 + -1;
        uVar17 = uVar16;
      } while (iVar26 != 0);
      auVar52 = __divti3(this,lVar21,uVar40,lVar43);
      uVar17 = (ulong)(auVar52._0_8_ < uVar16);
      lVar43 = auVar52._8_8_ - lVar24;
    } while ((SBORROW8(auVar52._8_8_,lVar24) != SBORROW8(lVar43,uVar17)) ==
             (long)(lVar43 - uVar17) < 0);
    piVar25 = (int128_t *)(long)(alpha * (double)(long)uVar22);
    local_290 = (long)piVar25 >> 0x3f;
    c = __divti3(this,lVar21,piVar25);
    local_2a0 = 6;
    if ((long)piVar25 < 0xd) {
      local_2a0 = (uint64_t)*(int *)(PhiTiny::pi + (long)piVar25 * 4);
    }
    pcVar2 = local_238 + 0x10;
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"=== pi_lmo_parallel1(x) ===","");
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_238._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"pi(x) = S1 + S2 + pi(y) - 1 - P2","");
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    x_00._8_8_ = in_stack_fffffffffffffc60;
    x_00._0_8_ = in_stack_fffffffffffffc58;
    print(this,(int128_t)x_00,lVar21,(int64_t)piVar25,c,alpha,(int)local_2a0);
    x_01._8_8_ = in_stack_fffffffffffffc60;
    x_01._0_8_ = in_stack_fffffffffffffc58;
    P2((int256_t *)&local_58,this,(int128_t)x_01,lVar21,(int)piVar25);
    generate_moebius(&local_140,(int64_t)piVar25);
    generate_lpf(&local_c0,(int64_t)piVar25);
    generate_primes(&local_250,(int64_t)piVar25);
    x_02._8_8_ = in_stack_fffffffffffffc60;
    x_02._0_8_ = in_stack_fffffffffffffc58;
    S1(&local_78,this,(int128_t)x_02,lVar21,(int64_t)piVar25,(int)local_2a0);
    local_238._8_8_ = 0.0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_238._0_8_ = pcVar2;
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_308._M_dataplus._M_p = (pointer)0x10;
    local_238._0_8_ = pcVar2;
    local_238._0_8_ = std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_308);
    local_238._16_8_ = local_308._M_dataplus._M_p;
    builtin_strncpy((char *)local_238._0_8_,"=== S2(x, y) ===",0x10);
    local_238._8_8_ = local_308._M_dataplus._M_p;
    *(char *)(local_238._0_8_ + (long)local_308._M_dataplus._M_p) = '\0';
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_308._M_dataplus._M_p = (pointer)0x21;
    local_238._0_8_ = pcVar2;
    local_238._0_8_ = std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_308);
    local_238._16_8_ = local_308._M_dataplus._M_p;
    builtin_strncpy((char *)local_238._0_8_,"Computation of the special leaves",0x21);
    local_238._8_8_ = local_308._M_dataplus._M_p;
    *(char *)(local_238._0_8_ + (long)local_308._M_dataplus._M_p) = '\0';
    print((string *)local_238);
    if ((char *)local_238._0_8_ != pcVar2) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    local_e8 = __udivti3(this,lVar21,piVar25,local_290);
    local_2b0 = local_e8 + 1;
    local_324 = ideal_num_threads(in_ECX,local_2b0,100000);
    x_03._8_8_ = in_stack_fffffffffffffc60;
    x_03._0_8_ = in_stack_fffffffffffffc58;
    S2LoadBalancer::S2LoadBalancer
              ((S2LoadBalancer *)local_238,(int128_t)x_03,(int64_t)this,lVar21,(int64_t)piVar25);
    local_278 = S2LoadBalancer::get_min_segment_size((S2LoadBalancer *)local_238);
    local_2b8 = 1;
    local_f8 = get_time();
    generate_pi(&local_180,(int64_t)piVar25);
    sVar27 = (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    local_308.field_2._M_allocated_capacity = 0;
    local_308.field_2._8_8_ = 0;
    local_308._M_dataplus._M_p = (pointer)0x0;
    local_308._M_string_length = 0;
    std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::vector
              (&local_128,sVar27,(value_type *)&local_308,(allocator_type *)&local_1e0);
    local_380 = 0;
    local_388 = 0;
    local_378 = (pointer)0x0;
    local_370 = 0;
    local_298 = piVar25;
    if (1 < (long)local_2b0) {
      local_1b8 = (double)(long)piVar25;
      local_d8 = local_2a0 + 1;
      local_e0 = SQRT(local_1b8);
      low = 1;
      do {
        lVar24 = (long)((local_e8 - low) + local_278) / (long)local_278;
        iVar26 = local_324;
        if (lVar24 < local_324) {
          iVar26 = (int)lVar24;
        }
        if (local_324 < 1) {
          iVar26 = 1;
        }
        sVar27 = (size_type)iVar26;
        lVar24 = (long)(lVar24 + sVar27 + -1) / (long)sVar27;
        if (local_2b8 < lVar24) {
          lVar24 = local_2b8;
        }
        if (local_2b8 < 1) {
          lVar24 = 1;
        }
        local_2b8 = lVar24;
        local_1c0 = low;
        std::
        vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
        ::vector(&local_a8,sVar27,(allocator_type *)&local_308);
        std::
        vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
        ::vector(&local_90,sVar27,(allocator_type *)&local_308);
        local_270 = sVar27;
        std::
        vector<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
        ::vector(&local_198,sVar27,(allocator_type *)&local_308);
        if (0 < iVar26) {
          local_2a8 = 0;
          do {
            dVar48 = get_time();
            paVar3 = local_a8.
                     super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_d0 = local_2a8 * 0x200;
            local_198.
            super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
            ._M_impl.super__Vector_impl_data._M_start[local_2a8].val[0] = dVar48;
            local_280 = local_90.
                        super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_1a8 = local_278;
            lVar24 = local_2b8 * local_278;
            local_2d0 = lVar24 * local_2a8 + local_1c0;
            auVar52 = __udivti3(this,lVar21,local_2d0,(long)local_2d0 >> 0x3f);
            uVar17 = auVar52._8_8_;
            dVar48 = (double)__floattidf(auVar52._0_8_,uVar17);
            if (dVar48 < 0.0) {
              dVar48 = sqrt(dVar48);
              uVar47 = SUB84(dVar48,0);
            }
            else {
              uVar47 = SUB84(SQRT(dVar48),0);
            }
            auVar50 = __fixunsdfti(uVar47);
            piVar39 = (int128_t *)(-(ulong)(auVar50._8_8_ != 0) | auVar50._0_8_);
            uVar22 = 0;
            do {
              auVar6._8_8_ = 0;
              auVar6._0_8_ = piVar39;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = piVar39;
              uVar16 = SUB168(auVar6 * auVar9,8) + (long)piVar39 * uVar22 * 2;
              bVar44 = piVar39 != (int128_t *)0x0;
              piVar15 = piVar39;
              piVar39 = (int128_t *)((long)piVar39 - 1);
              uVar40 = uVar22;
              uVar22 = (uVar22 - 1) + (ulong)bVar44;
            } while (uVar17 < uVar16 ||
                     uVar17 - uVar16 < (ulong)(auVar52._0_8_ < SUB168(auVar6 * auVar9,0)));
            do {
              uVar16 = uVar40;
              piVar39 = piVar15;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = piVar39;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = piVar39;
              auVar11._8_8_ = SUB168(auVar7 * auVar10,8) + (long)piVar39 * uVar16 * 2;
              auVar11._0_8_ = SUB168(auVar7 * auVar10,0);
              uVar17 = SUB168(auVar52 - auVar11,8);
              uVar22 = uVar16 << 1 | (ulong)piVar39 >> 0x3f;
              piVar15 = (int128_t *)((long)piVar39 + 1);
              uVar40 = uVar16 + ((int128_t *)0xfffffffffffffffe < piVar39);
            } while (uVar22 < uVar17 ||
                     uVar22 - uVar17 <
                     (ulong)((ulong)((long)piVar39 * 2) < SUB168(auVar52 - auVar11,0)));
            if (local_290 <= uVar16 && (ulong)(piVar39 < piVar25) <= uVar16 - local_290) {
              piVar39 = piVar25;
            }
            iVar34 = local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)piVar39];
            uVar47 = SUB84(local_e0,0);
            uVar49 = (undefined4)((ulong)local_e0 >> 0x20);
            if (local_1b8 < 0.0) {
              dVar48 = sqrt(local_1b8);
              uVar47 = SUB84(dVar48,0);
              uVar49 = (undefined4)((ulong)dVar48 >> 0x20);
            }
            paVar3 = paVar3 + local_2a8;
            lVar43 = (long)(double)CONCAT44(uVar49,uVar47);
            if (0xb504f332 < lVar43) {
              lVar43 = 0xb504f333;
            }
            lVar28 = lVar43 * 2;
            do {
              lVar28 = lVar28 + -2;
              lVar29 = lVar43 * lVar43;
              lVar43 = lVar43 + -1;
            } while (lVar29 - (long)piVar25 != 0 && (long)piVar25 <= lVar29);
            local_280 = local_280 + local_2a8;
            do {
              lVar43 = lVar43 + 1;
              lVar28 = lVar28 + 2;
            } while (lVar28 < (long)piVar25 - lVar43 * lVar43);
            sVar27 = (long)iVar34 + 1;
            uVar41 = lVar24 + local_2d0;
            if ((long)local_2b0 <= (long)uVar41) {
              uVar41 = local_2b0;
            }
            local_330 = 0;
            local_340 = 0;
            uVar22 = 0;
            uVar17 = 0;
            if (local_d8 < (long)sVar27) {
              iVar34 = *(int *)((long)local_180.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar28 * 2);
              iVar36 = local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar25];
              BitSieve::BitSieve(&local_1e0,local_1a8);
              local_1b0 = uVar41;
              Wheel::Wheel<std::vector<int,std::allocator<int>>>
                        (&local_110,&local_250,sVar27,local_2d0);
              local_308.field_2._M_allocated_capacity = 0;
              local_308.field_2._8_8_ = 0;
              local_308._M_dataplus._M_p = (pointer)0x0;
              local_308._M_string_length = 0;
              std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::resize
                        (paVar3->val,sVar27,(value_type *)&local_308);
              local_308.field_2._M_allocated_capacity = 0;
              local_308.field_2._8_8_ = 0;
              local_308._M_dataplus._M_p = (pointer)0x0;
              local_308._M_string_length = 0;
              std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::resize
                        (local_280->val,sVar27,(value_type *)&local_308);
              local_2d8 = 0;
              uVar17 = 0;
              local_330 = 0;
              local_340 = 0;
              if ((long)local_2d0 < (long)local_1b0) {
                iVar23 = (int)sVar27;
                if (iVar23 < iVar34) {
                  iVar34 = iVar23;
                }
                local_c8 = (long)iVar34;
                if (iVar23 < iVar36) {
                  iVar36 = iVar23;
                }
                local_1a0 = (long)iVar36;
                local_330 = 0;
                local_340 = 0;
                local_2d8 = 0;
                uVar17 = 0;
                uVar41 = local_2d0;
                do {
                  uVar38 = local_2a0;
                  local_2d0 = uVar41 + local_1a8;
                  uVar37 = local_2d0;
                  if ((long)local_1b0 < (long)local_2d0) {
                    uVar37 = local_1b0;
                  }
                  BitSieve::pre_sieve(&local_1e0,local_2a0,uVar41);
                  local_258 = uVar37 - uVar41;
                  local_2c0 = uVar41;
                  local_288 = uVar37;
                  do {
                    uVar38 = uVar38 + 1;
                    if (local_c8 <= (long)uVar38) goto LAB_0012234b;
                    uVar22 = (ulong)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar38];
                    local_2e0 = uVar17;
                    auVar52 = __udivti3(this,lVar21,local_288 * uVar22,
                                        (long)(local_288 * uVar22) >> 0x3f);
                    uVar41 = local_2c0;
                    piVar18 = (pointer)((long)piVar25 / (long)uVar22);
                    if ((ulong)((long)piVar18 >> 0x3f) < auVar52._8_8_ ||
                        ((long)piVar18 >> 0x3f) - auVar52._8_8_ < (ulong)(piVar18 < auVar52._0_8_))
                    {
                      piVar18 = auVar52._0_8_;
                    }
                    auVar52 = __udivti3(this,lVar21,local_2c0 * uVar22,
                                        (long)(local_2c0 * uVar22) >> 0x3f);
                    piVar39 = auVar52._0_8_;
                    if (local_290 <= auVar52._8_8_ &&
                        (ulong)(auVar52._0_8_ < piVar25) <= auVar52._8_8_ - local_290) {
                      piVar39 = piVar25;
                    }
                    if ((long)uVar22 < (long)piVar39) {
                      local_2c8 = uVar22;
                      local_268 = piVar39;
                      if ((long)piVar18 < (long)piVar39) {
                        uVar17 = 0;
                        local_260 = piVar18;
                        do {
                          piVar14 = local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                          if ((local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[(long)piVar39] != 0) &&
                             ((int)uVar22 <
                              local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)piVar39])) {
                            lVar43 = (long)piVar39 * uVar22;
                            lVar24 = __udivti3(this,lVar21,lVar43,lVar43 >> 0x3f);
                            if ((long)uVar17 <= (long)(lVar24 - uVar41)) {
                              piVar4 = paVar3->val[0].
                                       super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                              piVar5 = piVar4 + uVar38;
                              lVar28 = *(long *)((long)&piVar4[uVar38].high + 8);
                              uVar22 = (ulong)piVar4[uVar38].high;
                              uVar40 = (ulong)piVar4[uVar38].low;
                              uVar16 = *(ulong *)((long)&piVar4[uVar38].low + 8);
                              do {
                                uVar32 = (&BitSieve::set_bit_)[(uint)uVar17 & 0x7f] &
                                         local_1e0.sieve_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar17 >> 7];
                                if (uVar32 != 0) {
                                  uVar32 = uVar41 + uVar17;
                                }
                                uVar33 = (long)uVar32 >> 0x3f;
                                bVar44 = CARRY8(uVar22,uVar33);
                                uVar31 = uVar22 + uVar33;
                                bVar45 = CARRY8(uVar40,uVar32);
                                uVar40 = uVar40 + uVar32;
                                bVar46 = CARRY8(uVar16,uVar33);
                                uVar22 = uVar16 + uVar33;
                                uVar16 = uVar22 + bVar45;
                                uVar32 = (ulong)(bVar46 || CARRY8(uVar22,(ulong)bVar45));
                                uVar22 = uVar31 + uVar32;
                                lVar28 = lVar28 + uVar33 + (ulong)bVar44 +
                                         (ulong)CARRY8(uVar31,uVar32);
                                uVar17 = uVar17 + 2;
                              } while ((long)uVar17 <= (long)(lVar24 - uVar41));
                              *(ulong *)&piVar5->high = uVar22;
                              *(long *)((long)&piVar5->high + 8) = lVar28;
                              *(ulong *)&piVar5->low = uVar40;
                              *(ulong *)((long)&piVar5->low + 8) = uVar16;
                            }
                            local_308._M_dataplus._M_p = (pointer)(piVar14[(long)piVar39] * lVar43);
                            local_308._M_string_length = (long)local_308._M_dataplus._M_p >> 0x3f;
                            local_308.field_2._M_allocated_capacity = local_308._M_string_length;
                            local_308.field_2._8_8_ = local_308._M_string_length;
                            int256_t::operator*(&local_168,
                                                paVar3->val[0].
                                                super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar38,
                                                (int256_t *)&local_308);
                            bVar44 = local_330 < (ulong)local_168.high;
                            uVar40 = local_330 - (ulong)local_168.high;
                            bVar45 = local_2d8 < (ulong)local_168.low;
                            local_2d8 = local_2d8 - (ulong)local_168.low;
                            bVar46 = local_2e0 < local_168.low._8_8_;
                            uVar22 = local_2e0 - local_168.low._8_8_;
                            local_2e0 = uVar22 - bVar45;
                            uVar22 = (ulong)(bVar46 || uVar22 < bVar45);
                            local_330 = uVar40 - uVar22;
                            local_340 = ((local_340 - local_168.high._8_8_) - (ulong)bVar44) -
                                        (ulong)(uVar40 < uVar22);
                            uVar22 = lVar43 * local_140.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[(long)piVar39];
                            uVar32 = (long)uVar22 >> 0x3f;
                            piVar4 = local_280->val[0].
                                     super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            lVar24 = *(long *)((long)&piVar4[uVar38].high + 8);
                            uVar12 = piVar4[uVar38].high;
                            uVar31 = -uVar32 + (long)piVar4[uVar38].high;
                            piVar5 = piVar4 + uVar38;
                            uVar13 = piVar5->low;
                            *(ulong *)&piVar5->low = (long)piVar5->low - uVar22;
                            puVar1 = (ulong *)((long)&piVar4[uVar38].low + 8);
                            uVar16 = (ulong)((ulong)uVar13 < uVar22);
                            uVar40 = *puVar1;
                            uVar22 = *puVar1;
                            *puVar1 = (uVar22 - uVar32) - uVar16;
                            uVar22 = (ulong)(uVar40 < uVar32 || uVar22 - uVar32 < uVar16);
                            *(ulong *)&piVar4[uVar38].high = uVar31 - uVar22;
                            *(ulong *)((long)&piVar4[uVar38].high + 8) =
                                 (lVar24 + (ulong)CARRY8(-uVar32,(ulong)uVar12)) -
                                 (ulong)(uVar31 < uVar22);
                            uVar22 = local_2c8;
                            piVar18 = local_260;
                          }
                          piVar39 = (int128_t *)((long)piVar39 - 1);
                        } while ((long)piVar18 < (long)piVar39);
                      }
                      else {
                        uVar17 = 0;
                      }
                      piVar39 = local_268;
                      if ((long)uVar17 < local_258) {
                        piVar4 = paVar3->val[0].
                                 super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        piVar5 = piVar4 + uVar38;
                        lVar24 = *(long *)((long)&piVar4[uVar38].high + 8);
                        uVar22 = (ulong)piVar4[uVar38].high;
                        uVar40 = (ulong)piVar4[uVar38].low;
                        uVar16 = *(ulong *)((long)&piVar4[uVar38].low + 8);
                        do {
                          uVar32 = (&BitSieve::set_bit_)[(uint)uVar17 & 0x7f] &
                                   local_1e0.sieve_.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar17 >> 7];
                          if (uVar32 != 0) {
                            uVar32 = uVar41 + uVar17;
                          }
                          uVar33 = (long)uVar32 >> 0x3f;
                          bVar44 = CARRY8(uVar22,uVar33);
                          uVar31 = uVar22 + uVar33;
                          bVar45 = CARRY8(uVar40,uVar32);
                          uVar40 = uVar40 + uVar32;
                          bVar46 = CARRY8(uVar16,uVar33);
                          uVar22 = uVar16 + uVar33;
                          uVar16 = uVar22 + bVar45;
                          uVar32 = (ulong)(bVar46 || CARRY8(uVar22,(ulong)bVar45));
                          uVar22 = uVar31 + uVar32;
                          lVar24 = lVar24 + uVar33 + (ulong)bVar44 + (ulong)CARRY8(uVar31,uVar32);
                          uVar17 = uVar17 + 2;
                        } while ((long)uVar17 < local_258);
                        *(ulong *)&piVar5->high = uVar22;
                        *(long *)((long)&piVar5->high + 8) = lVar24;
                        *(ulong *)&piVar5->low = uVar40;
                        *(ulong *)((long)&piVar5->low + 8) = uVar16;
                      }
                      anon_unknown.dwarf_efe25::cross_off
                                (&local_1e0,uVar41,local_288,local_2c8,
                                 local_110.wheel_.
                                 super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar38);
                      uVar22 = local_2c8;
                      piVar25 = local_298;
                    }
                    uVar17 = local_2e0;
                  } while ((long)uVar22 < (long)piVar39);
LAB_00122754:
                  uVar41 = local_2d0;
                } while ((long)local_2d0 < (long)local_1b0);
              }
              if (local_110.wheel_.
                  super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_110.wheel_.
                                super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_110.wheel_.
                                      super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_110.wheel_.
                                      super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              uVar22 = local_2d8;
              if (local_1e0.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1e0.sieve_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_1e0.sieve_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1e0.sieve_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            bVar44 = CARRY8(local_388,local_330);
            local_330 = local_388 + local_330;
            bVar45 = CARRY8((ulong)local_378,uVar22);
            local_378 = local_378 + uVar22;
            bVar46 = CARRY8(local_370,uVar17);
            uVar17 = local_370 + uVar17;
            local_370 = uVar17 + bVar45;
            uVar17 = (ulong)(bVar46 || CARRY8(uVar17,(ulong)bVar45));
            local_388 = local_330 + uVar17;
            local_380 = local_380 + local_340 + (ulong)bVar44 + (ulong)CARRY8(local_330,uVar17);
            dVar48 = get_time();
            *(double *)
             ((long)(local_198.
                     super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                     ._M_impl.super__Vector_impl_data._M_start)->val + local_d0) =
                 dVar48 - *(double *)
                           ((long)(local_198.
                                   super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->val + local_d0);
            local_2a8 = local_2a8 + 1;
          } while (local_2a8 != local_270);
        }
        if (0 < iVar26) {
          sVar27 = 0;
          do {
            if (0x20 < (ulong)((long)local_a8.
                                     super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start[sVar27].val[0].
                                     super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a8.
                                    super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start[sVar27].val[0].
                                    super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              uVar17 = 1;
              lVar24 = 0x20;
              do {
                int256_t::operator*((int256_t *)&local_308,
                                    (int256_t *)
                                    ((long)&(local_90.
                                             super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start[sVar27].val
                                             [0].
                                             super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->low +
                                    lVar24),(int256_t *)
                                            ((long)&(local_128.
                                                                                                          
                                                  super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->low +
                                            lVar24));
                bVar44 = CARRY8(local_388,local_308.field_2._M_allocated_capacity);
                uVar40 = local_388 + local_308.field_2._M_allocated_capacity;
                bVar45 = CARRY8((ulong)local_378,(ulong)local_308._M_dataplus._M_p);
                local_378 = local_378 + local_308._M_dataplus._M_p;
                bVar46 = CARRY8(local_370,local_308._M_string_length);
                uVar22 = local_370 + local_308._M_string_length;
                local_370 = uVar22 + bVar45;
                uVar22 = (ulong)(bVar46 || CARRY8(uVar22,(ulong)bVar45));
                local_388 = uVar40 + uVar22;
                local_380 = local_380 + local_308.field_2._8_8_ + (ulong)bVar44 +
                            (ulong)CARRY8(uVar40,uVar22);
                piVar5 = local_a8.
                         super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar27].val[0].
                         super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar43 = *(long *)((long)&piVar5->high + lVar24 + 8U);
                uVar40 = *(ulong *)((long)&piVar5->high + lVar24);
                puVar1 = (ulong *)((long)&(local_128.
                                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->high + lVar24
                                  );
                uVar16 = *puVar1;
                uVar30 = uVar40 + *puVar1;
                lVar28 = *(long *)((long)&(local_128.
                                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->high +
                                  lVar24 + 8);
                uVar32 = *(ulong *)((long)&piVar5->low + lVar24);
                uVar31 = *(ulong *)((long)&piVar5->low + lVar24 + 8);
                puVar1 = (ulong *)((long)&(local_128.
                                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->low + lVar24)
                ;
                uVar22 = *puVar1;
                *puVar1 = *puVar1 + uVar32;
                puVar1 = (ulong *)((long)&(local_128.
                                           super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->low +
                                  lVar24 + 8);
                uVar32 = (ulong)CARRY8(uVar22,uVar32);
                uVar22 = *puVar1;
                uVar33 = *puVar1 + uVar31;
                *puVar1 = uVar33 + uVar32;
                uVar22 = (ulong)(CARRY8(uVar22,uVar31) || CARRY8(uVar33,uVar32));
                *(ulong *)((long)&(local_128.
                                   super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->high + lVar24) =
                     uVar30 + uVar22;
                *(ulong *)((long)&(local_128.
                                   super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->high + lVar24 + 8) =
                     lVar43 + lVar28 + (ulong)CARRY8(uVar40,uVar16) + (ulong)CARRY8(uVar30,uVar22);
                uVar17 = uVar17 + 1;
                lVar24 = lVar24 + 0x20;
              } while (uVar17 < (ulong)((long)local_a8.
                                              super__Vector_base<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start[sVar27].val
                                              [0].
                                              super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)piVar5 >> 5));
            }
            sVar27 = sVar27 + 1;
          } while (sVar27 != local_270);
        }
        low = local_1c0 + local_2b8 * local_270 * local_278;
        sVar27 = low;
        S2LoadBalancer::update
                  ((S2LoadBalancer *)local_238,low,local_270,(int64_t *)&local_278,&local_2b8,
                   (aligned_vector<double> *)&local_198);
        piVar25 = local_298;
        if (local_198.
            super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          sVar27 = (long)local_198.
                         super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                   (long)local_198.
                         super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          operator_delete(local_198.
                          super__Vector_base<primesum::aligned_vector<double>::align_t,_std::allocator<primesum::aligned_vector<double>::align_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,sVar27);
        }
        std::
        vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
        ::~vector(&local_90);
        std::
        vector<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t,_std::allocator<primesum::aligned_vector<std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>_>::align_t>_>
        ::~vector(&local_a8);
        local_324 = iVar26;
      } while ((long)low < (long)local_2b0);
    }
    local_308._M_string_length = 2;
    local_308.field_2._M_allocated_capacity._0_3_ = 0x3253;
    res.low._8_8_ = local_370;
    res.low._0_8_ = local_378;
    res.high._0_8_ = local_388;
    res.high._8_8_ = local_380;
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    print(&local_308,res,local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      sVar27 = local_308.field_2._M_allocated_capacity + 1;
      operator_delete(local_308._M_dataplus._M_p,sVar27);
    }
    if (local_128.super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      sVar27 = (long)local_128.
                     super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_128.
                     super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      operator_delete(local_128.
                      super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,sVar27);
    }
    if (local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      sVar27 = (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage -
               (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      operator_delete(local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,sVar27);
    }
    piVar25 = prime_sum_tiny(local_298,sVar27);
    __return_storage_ptr__ = local_f0;
    uVar33 = local_370 + local_78.low._8_8_ + (ulong)CARRY8((ulong)local_378,(ulong)local_78.low);
    uVar17 = (ulong)(CARRY8(local_370,local_78.low._8_8_) ||
                    CARRY8(local_370 + local_78.low._8_8_,
                           (ulong)CARRY8((ulong)local_378,(ulong)local_78.low)));
    uVar32 = local_388 + (ulong)local_78.high + uVar17;
    uVar16 = (long)extraout_RDX >> 0x3f;
    uVar31 = uVar32 + uVar16;
    pcVar19 = (pointer)((long)piVar25 + (long)(local_378 + (ulong)local_78.low));
    uVar22 = (ulong)CARRY8((ulong)piVar25,(ulong)(local_378 + (ulong)local_78.low));
    uVar40 = uVar33 + extraout_RDX;
    uVar30 = uVar40 + uVar22;
    uVar22 = (ulong)(CARRY8(uVar33,extraout_RDX) || CARRY8(uVar40,uVar22));
    uVar33 = uVar31 + uVar22;
    pcVar20 = pcVar19 + 0xffffffffffffffff;
    uVar40 = (ulong)(pcVar19 == (pointer)0x0);
    uVar42 = uVar30 - uVar40;
    uVar40 = (ulong)(uVar30 < uVar40);
    uVar30 = uVar33 - uVar40;
    lVar24 = uVar30 - local_48;
    lVar21 = (((uVar16 + local_380 + local_78.high._8_8_ +
                         (ulong)CARRY8(local_388,(ulong)local_78.high) +
                         (ulong)CARRY8(local_388 + (ulong)local_78.high,uVar17) +
                (ulong)CARRY8(uVar32,uVar16) + (ulong)CARRY8(uVar31,uVar22)) -
              (ulong)(uVar33 < uVar40)) - local_40) - (ulong)(uVar30 < local_48);
    *(undefined8 *)&local_f0->high = 0;
    *(undefined8 *)((long)&local_f0->high + 8) = 0;
    *(undefined8 *)&local_f0->low = 0;
    *(undefined8 *)((long)&local_f0->low + 8) = 0;
    uVar17 = (ulong)(pcVar20 < local_58);
    uVar22 = uVar42 - local_50;
    *(long *)&local_f0->high = lVar24;
    *(long *)((long)&local_f0->high + 8) = lVar21;
    *(long *)&local_f0->low = (long)pcVar20 - (long)local_58;
    *(ulong *)((long)&local_f0->low + 8) = uVar22 - uVar17;
    if (uVar42 < local_50 || uVar22 < uVar17) {
      *(long *)&local_f0->high = lVar24 + -1;
      *(ulong *)((long)&local_f0->high + 8) = lVar21 + -1 + (ulong)(lVar24 != 0);
    }
    if (local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    *(undefined8 *)&__return_storage_ptr__->high = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->low = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  }
  return __return_storage_ptr__;
LAB_0012234b:
  if (local_1a0 <= (long)uVar38) goto LAB_00122754;
  local_260 = local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  iVar34 = local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar38];
  uVar22 = (ulong)iVar34;
  auVar52 = __udivti3(this,lVar21,local_2c0 * uVar22,(long)(local_2c0 * uVar22) >> 0x3f);
  piVar39 = auVar52._0_8_;
  if (local_290 <= auVar52._8_8_ && (ulong)(auVar52._0_8_ < piVar25) <= auVar52._8_8_ - local_290) {
    piVar39 = piVar25;
  }
  lVar24 = (long)local_180.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)piVar39];
  auVar52 = __udivti3(this,lVar21,local_288 * uVar22,(long)(local_288 * uVar22) >> 0x3f);
  uVar40 = (long)piVar25 / (long)uVar22;
  if ((long)piVar25 / (long)uVar22 <= (long)uVar22) {
    uVar40 = uVar22;
  }
  if ((ulong)((long)uVar40 >> 0x3f) < auVar52._8_8_ ||
      ((long)uVar40 >> 0x3f) - auVar52._8_8_ < (ulong)(uVar40 < auVar52._0_8_)) {
    uVar40 = auVar52._0_8_;
  }
  iVar36 = local_260[lVar24];
  piVar39 = (int128_t *)(long)iVar36;
  if (iVar34 < iVar36) {
    local_2e0 = uVar22;
    local_268 = piVar39;
    if ((long)uVar40 < (long)piVar39) {
      piVar35 = local_260 + lVar24;
      uVar16 = 0;
      local_2c8 = uVar40;
      do {
        uVar41 = local_2c0;
        lVar43 = __udivti3(this,lVar21,(long)piVar39 * uVar22,(long)((long)piVar39 * uVar22) >> 0x3f
                          );
        uVar22 = local_2e0;
        lVar43 = lVar43 - uVar41;
        if ((long)uVar16 <= lVar43) {
          piVar4 = paVar3->val[0].
                   super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          piVar5 = piVar4 + uVar38;
          lVar28 = *(long *)((long)&piVar4[uVar38].high + 8);
          uVar40 = (ulong)piVar4[uVar38].high;
          uVar32 = (ulong)piVar4[uVar38].low;
          uVar31 = *(ulong *)((long)&piVar4[uVar38].low + 8);
          do {
            uVar33 = (&BitSieve::set_bit_)[(uint)uVar16 & 0x7f] &
                     local_1e0.sieve_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16 >> 7];
            if (uVar33 != 0) {
              uVar33 = uVar41 + uVar16;
            }
            uVar42 = (long)uVar33 >> 0x3f;
            bVar44 = CARRY8(uVar40,uVar42);
            uVar30 = uVar40 + uVar42;
            bVar45 = CARRY8(uVar32,uVar33);
            uVar32 = uVar32 + uVar33;
            bVar46 = CARRY8(uVar31,uVar42);
            uVar40 = uVar31 + uVar42;
            uVar31 = uVar40 + bVar45;
            uVar33 = (ulong)(bVar46 || CARRY8(uVar40,(ulong)bVar45));
            uVar40 = uVar30 + uVar33;
            lVar28 = lVar28 + uVar42 + (ulong)bVar44 + (ulong)CARRY8(uVar30,uVar33);
            uVar16 = uVar16 + 2;
          } while ((long)uVar16 <= lVar43);
          *(ulong *)&piVar5->high = uVar40;
          *(long *)((long)&piVar5->high + 8) = lVar28;
          *(ulong *)&piVar5->low = uVar32;
          *(ulong *)((long)&piVar5->low + 8) = uVar31;
        }
        local_308._M_dataplus._M_p = (pointer)((long)*piVar35 * local_2e0);
        local_308._M_string_length = (long)local_308._M_dataplus._M_p >> 0x3f;
        local_308.field_2._M_allocated_capacity = local_308._M_string_length;
        local_308.field_2._8_8_ = local_308._M_string_length;
        int256_t::operator*(&local_168,
                            paVar3->val[0].
                            super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar38,
                            (int256_t *)&local_308);
        bVar44 = CARRY8(local_330,(ulong)local_168.high);
        uVar32 = local_330 + (ulong)local_168.high;
        bVar45 = CARRY8(local_2d8,(ulong)local_168.low);
        local_2d8 = local_2d8 + (ulong)local_168.low;
        bVar46 = CARRY8(uVar17,local_168.low._8_8_);
        uVar40 = uVar17 + local_168.low._8_8_;
        uVar17 = uVar40 + bVar45;
        uVar40 = (ulong)(bVar46 || CARRY8(uVar40,(ulong)bVar45));
        local_330 = uVar32 + uVar40;
        local_340 = local_340 + local_168.high._8_8_ + (ulong)bVar44 + (ulong)CARRY8(uVar32,uVar40);
        piVar35 = local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar24 + -1;
        uVar40 = (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar24] * uVar22;
        uVar30 = (long)uVar40 >> 0x3f;
        piVar4 = local_280->val[0].
                 super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar31 = (ulong)piVar4[uVar38].high;
        uVar42 = uVar31 + uVar30;
        lVar43 = *(long *)((long)&piVar4[uVar38].high + 8);
        piVar5 = piVar4 + uVar38;
        uVar12 = piVar5->low;
        *(ulong *)&piVar5->low = (long)piVar5->low + uVar40;
        puVar1 = (ulong *)((long)&piVar4[uVar38].low + 8);
        uVar33 = (ulong)CARRY8((ulong)uVar12,uVar40);
        uVar40 = *puVar1;
        uVar32 = *puVar1;
        *puVar1 = uVar32 + uVar30 + uVar33;
        uVar40 = (ulong)(CARRY8(uVar40,uVar30) || CARRY8(uVar32 + uVar30,uVar33));
        *(ulong *)&piVar4[uVar38].high = uVar42 + uVar40;
        *(ulong *)((long)&piVar4[uVar38].high + 8) =
             lVar43 + uVar30 + (ulong)CARRY8(uVar31,uVar30) + (ulong)CARRY8(uVar42,uVar40);
        lVar24 = lVar24 + -1;
        piVar39 = (int128_t *)(long)*piVar35;
      } while ((long)local_2c8 < (long)piVar39);
    }
    else {
      uVar16 = 0;
    }
    piVar25 = local_298;
    if ((long)uVar16 < local_258) {
      piVar4 = paVar3->val[0].
               super__Vector_base<primesum::int256_t,_std::allocator<primesum::int256_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = piVar4 + uVar38;
      lVar24 = *(long *)((long)&piVar4[uVar38].high + 8);
      uVar22 = (ulong)piVar4[uVar38].high;
      uVar40 = (ulong)piVar4[uVar38].low;
      uVar32 = *(ulong *)((long)&piVar4[uVar38].low + 8);
      do {
        uVar31 = (&BitSieve::set_bit_)[(uint)uVar16 & 0x7f] &
                 local_1e0.sieve_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar16 >> 7];
        if (uVar31 != 0) {
          uVar31 = local_2c0 + uVar16;
        }
        uVar30 = (long)uVar31 >> 0x3f;
        bVar44 = CARRY8(uVar22,uVar30);
        uVar33 = uVar22 + uVar30;
        bVar45 = CARRY8(uVar40,uVar31);
        uVar40 = uVar40 + uVar31;
        bVar46 = CARRY8(uVar32,uVar30);
        uVar22 = uVar32 + uVar30;
        uVar32 = uVar22 + bVar45;
        uVar31 = (ulong)(bVar46 || CARRY8(uVar22,(ulong)bVar45));
        uVar22 = uVar33 + uVar31;
        lVar24 = lVar24 + uVar30 + (ulong)bVar44 + (ulong)CARRY8(uVar33,uVar31);
        uVar16 = uVar16 + 2;
      } while ((long)uVar16 < local_258);
      *(ulong *)&piVar5->high = uVar22;
      *(long *)((long)&piVar5->high + 8) = lVar24;
      *(ulong *)&piVar5->low = uVar40;
      *(ulong *)((long)&piVar5->low + 8) = uVar32;
      uVar22 = local_2e0;
    }
    anon_unknown.dwarf_efe25::cross_off
              (&local_1e0,local_2c0,local_288,uVar22,
               local_110.wheel_.
               super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>._M_impl
               .super__Vector_impl_data._M_start + uVar38);
    iVar34 = (int)local_2e0;
    iVar36 = (int)local_268;
  }
  if (iVar36 <= iVar34) goto LAB_00122754;
  uVar38 = uVar38 + 1;
  goto LAB_0012234b;
}

Assistant:

int256_t pi_lmo_parallel1(int128_t x, int threads)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_lmo_parallel1(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, threads);

  int256_t p2 = P2(x, y, threads);
  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, threads);
  int256_t s2 = S2(x, y, c, primes, lpf, mu, threads);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}